

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

ssize_t __thiscall Reader::read(Reader *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  undefined4 in_register_00000034;
  Model *this_00;
  Reader *unaff_retaddr;
  int num_objective_section;
  size_t i;
  Reader *in_stack_00000038;
  Reader *in_stack_00000220;
  size_type in_stack_ffffffffffffffb8;
  Reader *__x;
  Model *pMVar2;
  Model *this_01;
  
  this_00 = (Model *)CONCAT44(in_register_00000034,__fd);
  this_00[8].variables.
  super__Vector_base<std::shared_ptr<Variable>,_std::allocator<std::shared_ptr<Variable>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __x = this;
  this_01 = this_00;
  for (pMVar2 = (Model *)0x0; pMVar2 < (Model *)0x3;
      pMVar2 = (Model *)((long)&(pMVar2->objective).
                                super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                        1)) {
    do {
      std::array<RawToken,_3UL>::operator[]((array<RawToken,_3UL> *)this,in_stack_ffffffffffffffb8);
      bVar1 = readnexttoken(in_stack_00000038,(RawToken *)i);
    } while (((bVar1 ^ 0xffU) & 1) != 0);
  }
  processtokens(in_stack_00000220);
  std::__cxx11::string::clear();
  std::__cxx11::string::shrink_to_fit();
  splittokens(unaff_retaddr);
  std::
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  ::count((map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
           *)this_00,(key_type *)__x);
  std::
  map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
  ::count((map<LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>,_std::less<LpSectionKeyword>,_std::allocator<std::pair<const_LpSectionKeyword,_std::pair<__gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>,___gnu_cxx::__normal_iterator<ProcessedToken_*,_std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>_>_>_>_>_>
           *)this_00,(key_type *)__x);
  lpassert(SUB81((ulong)this_00 >> 0x38,0));
  processsections(this);
  std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>::clear
            ((vector<ProcessedToken,_std::allocator<ProcessedToken>_> *)0x41b2b4);
  std::vector<ProcessedToken,_std::allocator<ProcessedToken>_>::shrink_to_fit
            ((vector<ProcessedToken,_std::allocator<ProcessedToken>_> *)0x41b2c5);
  Model::Model(this_01,pMVar2);
  return (ssize_t)__x;
}

Assistant:

Model Reader::read() {
  // std::clog << "Reading input, tokenizing..." << std::endl;
  this->linebufferpos = 0;
  // read first NRAWTOKEN token
  // if file ends early, then all remaining tokens are set to FLEND
  for (size_t i = 0; i < NRAWTOKEN; ++i)
    while (!readnexttoken(rawtokens[i]))
      ;

  processtokens();

  linebuffer.clear();
  linebuffer.shrink_to_fit();

  // std::clog << "Splitting tokens..." << std::endl;
  splittokens();

  // std::clog << "Setting up model..." << std::endl;
  //
  // Since
  //
  // "The problem statement must begin with the word MINIMIZE or
  // MAXIMIZE, MINIMUM or MAXIMUM, or the abbreviations MIN or MAX, in
  // any combination of upper- and lower-case characters. The word
  // introduces the objective function section."
  //
  // Use positivity of sectiontokens.count(LpSectionKeyword::OBJMIN) +
  // sectiontokens.count(LpSectionKeyword::OBJMAX) to identify garbage file
  //

  const int num_objective_section =
    sectiontokens.count(LpSectionKeyword::OBJMIN) +
    sectiontokens.count(LpSectionKeyword::OBJMAX);
  lpassert(num_objective_section>0);

  processsections();
  processedtokens.clear();
  processedtokens.shrink_to_fit();

  return builder.model;
}